

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_jnz_ecx(DisasContext *s,MemOp size,TCGLabel *label1)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  TCGLabel *label1_local;
  MemOp size_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_mov_i64_x86_64(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_regs[1]);
  gen_extu(tcg_ctx_00,size,s->tmp0);
  tcg_gen_brcondi_i64_x86_64(tcg_ctx_00,TCG_COND_NE,s->tmp0,0,label1);
  return;
}

Assistant:

static inline
void gen_op_jnz_ecx(DisasContext *s, MemOp size, TCGLabel *label1)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_regs[R_ECX]);
    gen_extu(tcg_ctx, size, s->tmp0);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, s->tmp0, 0, label1);
}